

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_makeClosureWithCaptures
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionDefinitionOperand,
               size_t captureCount,int16_t *elementOperands)

{
  ulong local_30;
  size_t i;
  int16_t *elementOperands_local;
  size_t captureCount_local;
  int16_t functionDefinitionOperand_local;
  int16_t resultOperand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (-1 < resultOperand) {
    sysbvm_jit_x86_jitLoadContextInRegister(jit,SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionDefinitionOperand);
    sysbvm_jit_x86_call(jit,sysbvm_sequenceTuple_createForFunctionDefinition);
    sysbvm_jit_x86_mov64Register(jit,SYSBVM_X86_64_ARG2,SYSBVM_X86_64_CALL_SHADOW_SPACE);
    for (local_30 = 0; local_30 < captureCount; local_30 = local_30 + 1) {
      sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,elementOperands[local_30]);
      sysbvm_jit_x86_mov64IntoMemoryWithOffset
                (jit,SYSBVM_X86_64_ARG2,(int)(local_30 << 3) + 0x10,SYSBVM_X86_64_ARG1);
    }
    sysbvm_jit_x86_jitLoadContextInRegister(jit,SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionDefinitionOperand);
    sysbvm_jit_x86_call(jit,sysbvm_function_createClosureWithCaptureVector);
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,SYSBVM_X86_64_CALL_SHADOW_SPACE);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeClosureWithCaptures(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionDefinitionOperand, size_t captureCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    // Make the capture vector.
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionDefinitionOperand);
    sysbvm_jit_x86_call(jit, &sysbvm_sequenceTuple_createForFunctionDefinition);

    sysbvm_jit_x86_mov64Register(jit, SYSBVM_X86_64_ARG2, SYSBVM_X86_RAX);
    for(size_t i = 0; i < captureCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, elementOperands[i]);
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_64_ARG2, (int32_t) (sizeof(sysbvm_tuple_header_t) + i * sizeof(void*)), SYSBVM_X86_64_ARG1);
    }

    // Now construct the actual closure
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, functionDefinitionOperand);
    sysbvm_jit_x86_call(jit, &sysbvm_function_createClosureWithCaptureVector);
    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}